

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-test.c++
# Opt level: O3

void __thiscall kj::anon_unknown_0::TestCase1395::run(TestCase1395 *this)

{
  SourceLocation location;
  SourceLocation location_00;
  PromiseBase node;
  Fault node_00;
  bool bVar1;
  WeakFulfiller<void> *pWVar2;
  DebugExpression<bool> _kjCondition;
  PromiseFulfillerPair<void> paf;
  Fault f;
  WaitScope waitScope;
  EventLoop loop;
  DebugExpression<bool> local_f9;
  PromiseBase local_f8;
  WeakFulfillerBase *local_f0;
  WeakFulfiller<void> *local_e8;
  Fault local_e0;
  char *pcStack_d8;
  undefined8 local_d0;
  WaitScope local_c8;
  char *local_a8;
  char *pcStack_a0;
  undefined8 local_98;
  EventLoop local_90;
  
  EventLoop::EventLoop(&local_90);
  local_c8.busyPollInterval = 0xffffffff;
  local_c8.fiber.ptr = (FiberBase *)0x0;
  local_c8.runningStacksPool.ptr = (FiberPool *)0x0;
  local_c8.loop = &local_90;
  EventLoop::enterScope(&local_90);
  pWVar2 = (WeakFulfiller<void> *)operator_new(0x18);
  (pWVar2->super_WeakFulfillerBase).inner = (PromiseRejector *)0x0;
  (pWVar2->super_PromiseFulfiller<void>).super_PromiseRejector._vptr_PromiseRejector =
       (_func_int **)&PTR_reject_00605058;
  (pWVar2->super_WeakFulfillerBase).super_Disposer._vptr_Disposer =
       (_func_int **)&PTR_disposeImpl_00605090;
  kj::_::PromiseDisposer::
  alloc<kj::_::AdapterPromiseNode<kj::_::Void,kj::_::PromiseAndFulfillerAdapter<void>>,kj::_::PromiseDisposer,kj::_::WeakFulfiller<void>&>
            ((PromiseDisposer *)&local_e0,pWVar2);
  node_00.exception = local_e0.exception;
  local_f8.node.ptr = (OwnPromiseNode)(OwnPromiseNode)local_e0.exception;
  local_e0.exception = (Exception *)0x48a040;
  pcStack_d8 = "run";
  local_d0 = 0x2900000578;
  location.function = "run";
  location.fileName =
       "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++"
  ;
  location.lineNumber = 0x578;
  location.columnNumber = 0x29;
  local_f0 = &pWVar2->super_WeakFulfillerBase;
  local_e8 = pWVar2;
  bVar1 = kj::_::pollImpl((PromiseNode *)node_00.exception,&local_c8,location);
  local_f9.value = !bVar1;
  if (bVar1) {
    kj::_::Debug::Fault::Fault<kj::Exception::Type,kj::_::DebugExpression<bool>&>
              (&local_e0,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++"
               ,0x578,FAILED,"!paf.promise.poll(waitScope)","_kjCondition,",&local_f9);
    kj::_::Debug::Fault::fatal(&local_e0);
  }
  (*(local_e8->super_PromiseFulfiller<void>).super_PromiseRejector._vptr_PromiseRejector[2])
            (local_e8,&local_e0);
  local_e0.exception = (Exception *)0x48a040;
  pcStack_d8 = "run";
  local_d0 = 0x280000057a;
  location_00.function = "run";
  location_00.fileName =
       "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++"
  ;
  location_00.lineNumber = 0x57a;
  location_00.columnNumber = 0x28;
  local_f9.value = kj::_::pollImpl((PromiseNode *)local_f8.node.ptr,&local_c8,location_00);
  if (local_f9.value) {
    local_a8 = 
    "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++"
    ;
    pcStack_a0 = "run";
    local_98 = 0x30000057b;
    Promise<void>::wait((Promise<void> *)&local_f8,&local_c8);
    pWVar2 = local_e8;
    if (local_e8 != (WeakFulfiller<void> *)0x0) {
      local_e8 = (WeakFulfiller<void> *)0x0;
      (**(local_f0->super_Disposer)._vptr_Disposer)
                (local_f0,(pWVar2->super_PromiseFulfiller<void>).super_PromiseRejector.
                          _vptr_PromiseRejector[-2] +
                          (long)&(pWVar2->super_PromiseFulfiller<void>).super_PromiseRejector.
                                 _vptr_PromiseRejector);
    }
    node.node.ptr = local_f8.node.ptr;
    if (local_f8.node.ptr != (PromiseNode *)0x0) {
      local_f8.node.ptr = (OwnPromiseNode)(PromiseNode *)0x0;
      kj::_::PromiseDisposer::dispose((PromiseArenaMember *)node.node.ptr);
    }
    if (local_c8.fiber.ptr == (FiberBase *)0x0) {
      EventLoop::leaveScope(local_c8.loop);
    }
    EventLoop::~EventLoop(&local_90);
    return;
  }
  kj::_::Debug::Fault::Fault<kj::Exception::Type,kj::_::DebugExpression<bool>&>
            (&local_e0,
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++"
             ,0x57a,FAILED,"paf.promise.poll(waitScope)","_kjCondition,",&local_f9);
  kj::_::Debug::Fault::fatal(&local_e0);
}

Assistant:

TEST(Async, Poll) {
  EventLoop loop;
  WaitScope waitScope(loop);

  auto paf = newPromiseAndFulfiller<void>();
  KJ_ASSERT(!paf.promise.poll(waitScope));
  paf.fulfiller->fulfill();
  KJ_ASSERT(paf.promise.poll(waitScope));
  paf.promise.wait(waitScope);
}